

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

ssize_t bgzf_write(BGZF *fp,void *data,size_t length)

{
  hFILE *fp_00;
  int iVar1;
  long lVar2;
  ssize_t sVar3;
  size_t __n;
  size_t sVar4;
  ulong uVar5;
  
  if (((undefined1  [96])*fp & (undefined1  [96])0x60000000) == (undefined1  [96])0x0) {
    fp_00 = fp->fp;
    uVar5 = (long)fp_00->limit - (long)fp_00->begin;
    sVar4 = length;
    if (uVar5 < length) {
      sVar4 = uVar5;
    }
    memcpy(fp_00->begin,data,sVar4);
    fp_00->begin = fp_00->begin + sVar4;
    if (uVar5 < length) {
      sVar3 = hwrite2(fp_00,data,length,sVar4);
      return sVar3;
    }
  }
  else {
    if (((undefined1  [96])*fp & (undefined1  [96])0x30000) == (undefined1  [96])0x0) {
      __assert_fail("fp->is_write",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/bgzf.c"
                    ,0x307,"ssize_t bgzf_write(BGZF *, const void *, size_t)");
    }
    sVar4 = length;
    if (0 < (long)length) {
      do {
        lVar2 = 0xff00 - (long)fp->block_offset;
        iVar1 = (int)sVar4;
        if (lVar2 <= (long)sVar4) {
          iVar1 = (int)lVar2;
        }
        __n = (size_t)iVar1;
        memcpy((void *)((long)fp->block_offset + (long)fp->uncompressed_block),data,__n);
        iVar1 = fp->block_offset + iVar1;
        fp->block_offset = iVar1;
        if ((iVar1 == 0xff00) && (iVar1 = lazy_flush(fp), iVar1 != 0)) {
          return -1;
        }
        data = (void *)((long)data + __n);
        sVar4 = sVar4 - __n;
      } while (0 < (long)sVar4);
    }
    sVar4 = length - sVar4;
  }
  return sVar4;
}

Assistant:

ssize_t bgzf_write(BGZF *fp, const void *data, size_t length)
{
    if ( !fp->is_compressed )
        return hwrite(fp->fp, data, length);

    const uint8_t *input = (const uint8_t*)data;
    ssize_t remaining = length;
    assert(fp->is_write);
    while (remaining > 0) {
        uint8_t* buffer = (uint8_t*)fp->uncompressed_block;
        int copy_length = BGZF_BLOCK_SIZE - fp->block_offset;
        if (copy_length > remaining) copy_length = remaining;
        memcpy(buffer + fp->block_offset, input, copy_length);
        fp->block_offset += copy_length;
        input += copy_length;
        remaining -= copy_length;
        if (fp->block_offset == BGZF_BLOCK_SIZE) {
            if (lazy_flush(fp) != 0) return -1;
        }
    }
    return length - remaining;
}